

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void setpause(global_State *g,l_mem estimate)

{
  undefined1 auVar1 [16];
  long local_38;
  l_mem threshold;
  l_mem debt;
  l_mem estimate_local;
  global_State *g_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = SUB168(SEXT816(0x7ffffffffffffffc),8);
  if ((long)g->gcpause <
      SUB168((auVar1 << 0x40 | ZEXT816(0x7ffffffffffffffc)) / SEXT816(estimate / 100),0)) {
    local_38 = (estimate / 100) * (long)g->gcpause;
  }
  else {
    local_38 = 0x7ffffffffffffffc;
  }
  luaE_setdebt(g,-(local_38 - (g->totalbytes + g->GCdebt)));
  return;
}

Assistant:

static void setpause (global_State *g, l_mem estimate) {
  l_mem debt, threshold;
  estimate = estimate / PAUSEADJ;  /* adjust 'estimate' */
  threshold = (g->gcpause < MAX_LMEM / estimate)  /* overflow? */
            ? estimate * g->gcpause  /* no overflow */
            : MAX_LMEM;  /* overflow; truncate to maximum */
  debt = -cast(l_mem, threshold - gettotalbytes(g));
  luaE_setdebt(g, debt);
}